

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj_test.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  rk_u32 flag;
  char *name;
  rk_s32 local_10;
  rk_u32 i;
  MPP_RET ret;
  
  local_10 = -1;
  _mpp_log_l(4,"kmpp_obj_test","start\n",0);
  name._4_4_ = 0;
  do {
    if (2 < name._4_4_) {
LAB_0010133e:
      pcVar1 = "success";
      if (local_10 != 0) {
        pcVar1 = "failed";
      }
      _mpp_log_l(4,"kmpp_obj_test","done %s \n",0,pcVar1);
      return local_10;
    }
    pcVar1 = obj_tests[name._4_4_].name;
    local_10 = (*obj_tests[name._4_4_].func)(pcVar1,obj_tests[name._4_4_].flag);
    if (local_10 != 0) {
      _mpp_log_l(4,"kmpp_obj_test","test %-16s failed ret %d\n",0,pcVar1,local_10);
      goto LAB_0010133e;
    }
    _mpp_log_l(4,"kmpp_obj_test","test %-16s success\n",0,pcVar1);
    name._4_4_ = name._4_4_ + 1;
  } while( true );
}

Assistant:

int main()
{
    MPP_RET ret = MPP_NOK;
    rk_u32 i;

    mpp_log("start\n");

    for (i = 0; i < MPP_ARRAY_ELEMS(obj_tests); i++) {
        const char *name = obj_tests[i].name;
        rk_u32 flag = obj_tests[i].flag;

        ret = obj_tests[i].func(name, flag);
        if (ret) {
            mpp_log("test %-16s failed ret %d\n", name, ret);
            goto done;
        }
        mpp_log("test %-16s success\n", name);
    }

done:
    mpp_log("done %s \n", ret ? "failed" : "success");

    return ret;
}